

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_job_pool.hpp
# Opt level: O0

mmap_disk_job * __thiscall
libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::
allocate_job<libtorrent::aux::job::read,std::shared_ptr<libtorrent::aux::mmap_storage>,std::function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>,libtorrent::disk_buffer_holder,unsigned_short,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,int_const&>
          (disk_job_pool<libtorrent::aux::mmap_disk_job> *this,disk_job_flags_t flags,
          shared_ptr<libtorrent::aux::mmap_storage> *stor,
          function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)> *args,
          disk_buffer_holder *args_1,unsigned_short *args_2,
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *args_3,int *args_4)

{
  mmap_disk_job *pmVar1;
  function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)> *__nbytes;
  void *__buf;
  int __fd;
  mutex *__m;
  read local_128;
  tailqueue_node<libtorrent::aux::disk_job> local_e0;
  undefined1 local_d8 [144];
  mmap_disk_job *local_48;
  element_type *ptr;
  lock_guard<std::mutex> l;
  unsigned_short *args_local_2;
  disk_buffer_holder *args_local_1;
  function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)> *args_local;
  shared_ptr<libtorrent::aux::mmap_storage> *stor_local;
  disk_job_pool<libtorrent::aux::mmap_disk_job> *this_local;
  disk_job_flags_t flags_local;
  
  __m = &this->m_job_mutex;
  __nbytes = args;
  l._M_device = (mutex_type *)args_2;
  ::std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&ptr,__m);
  pmVar1 = (mmap_disk_job *)
           boost::object_pool<libtorrent::aux::mmap_disk_job,_libtorrent::aux::allocator_new_delete>
           ::malloc(&this->m_job_pool,(size_t)__m);
  local_48 = pmVar1;
  tailqueue_node<libtorrent::aux::disk_job>::tailqueue_node(&local_e0);
  local_d8._0_8_ = local_e0.next;
  local_d8[8] = flags.m_val;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>::
  bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *)
                (local_d8 + 9));
  storage_error::storage_error((storage_error *)(local_d8 + 0x10));
  ::std::function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)>::
  function(&local_128.handler,args);
  disk_buffer_holder::disk_buffer_holder(&local_128.buf,args_1);
  local_128.buffer_size = *(uint16_t *)&((l._M_device)->super___mutex_base)._M_mutex;
  local_128.piece.m_val = args_3->m_val;
  local_128.offset = *args_4;
  ::std::
  variant<libtorrent::aux::job::read,libtorrent::aux::job::write,libtorrent::aux::job::hash,libtorrent::aux::job::hash2,libtorrent::aux::job::move_storage,libtorrent::aux::job::release_files,libtorrent::aux::job::delete_files,libtorrent::aux::job::check_fastresume,libtorrent::aux::job::rename_file,libtorrent::aux::job::stop_torrent,libtorrent::aux::job::file_priority,libtorrent::aux::job::clear_piece,libtorrent::aux::job::partial_read>
  ::variant<libtorrent::aux::job::read,void,void,libtorrent::aux::job::read,void>
            ((variant<libtorrent::aux::job::read,libtorrent::aux::job::write,libtorrent::aux::job::hash,libtorrent::aux::job::hash2,libtorrent::aux::job::move_storage,libtorrent::aux::job::release_files,libtorrent::aux::job::delete_files,libtorrent::aux::job::check_fastresume,libtorrent::aux::job::rename_file,libtorrent::aux::job::stop_torrent,libtorrent::aux::job::file_priority,libtorrent::aux::job::clear_piece,libtorrent::aux::job::partial_read>
              *)(local_d8 + 0x28),&local_128);
  disk_job::disk_job((disk_job *)pmVar1,(disk_job *)local_d8);
  ::std::shared_ptr<libtorrent::aux::mmap_storage>::shared_ptr(&pmVar1->storage,stor);
  __fd = (int)stor;
  disk_job::~disk_job((disk_job *)local_d8);
  job::read::~read(&local_128,__fd,__buf,(size_t)__nbytes);
  boost::object_pool<libtorrent::aux::mmap_disk_job,_libtorrent::aux::allocator_new_delete>::
  set_next_size(&this->m_job_pool,100);
  pmVar1 = local_48;
  this->m_jobs_in_use = this->m_jobs_in_use + 1;
  this->m_read_jobs = this->m_read_jobs + 1;
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&ptr);
  return pmVar1;
}

Assistant:

T* allocate_job(
			disk_job_flags_t const flags
			, Storage stor
			, Args&&... args)
		{
			std::lock_guard<std::mutex> l(m_job_mutex);
			auto* ptr = m_job_pool.malloc();
			new (ptr) T{
				disk_job{
				tailqueue_node<disk_job>{},
				flags,
				status_t{},
				storage_error{},
				JobType{std::forward<Args>(args)...},
#if TORRENT_USE_ASSERTS
				true, // in_use
				false, // job_posted
				false, // callback_called
				false, // blocked
#endif
				},
				std::move(stor)};
			m_job_pool.set_next_size(100);
			++m_jobs_in_use;
			if constexpr (std::is_same_v<JobType, job::read>)
				++m_read_jobs;
			else if constexpr (std::is_same_v<JobType, job::write>)
				++m_write_jobs;

			return ptr;
		}